

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int default_RNG(uint8_t *dest,uint size)

{
  ssize_t sVar1;
  ssize_t bytes_read;
  size_t left;
  char *ptr;
  int fd;
  uint size_local;
  uint8_t *dest_local;
  
  ptr._0_4_ = open("/dev/urandom",0x80000);
  if (((int)ptr == -1) && (ptr._0_4_ = open("/dev/random",0x80000), (int)ptr == -1)) {
    dest_local._4_4_ = 0;
  }
  else {
    left = (size_t)dest;
    for (bytes_read = (ssize_t)size; bytes_read != 0; bytes_read = bytes_read - sVar1) {
      sVar1 = read((int)ptr,(void *)left,bytes_read);
      if (sVar1 < 1) {
        close((int)ptr);
        return 0;
      }
      left = sVar1 + left;
    }
    close((int)ptr);
    dest_local._4_4_ = 1;
  }
  return dest_local._4_4_;
}

Assistant:

static int default_RNG(uint8_t *dest, unsigned size) {
    int fd = open("/dev/urandom", O_RDONLY | O_CLOEXEC);
    if (fd == -1) {
        fd = open("/dev/random", O_RDONLY | O_CLOEXEC);
        if (fd == -1) {
            return 0;
        }
    }

    char *ptr = (char *)dest;
    size_t left = size;
    while (left > 0) {
        ssize_t bytes_read = read(fd, ptr, left);
        if (bytes_read <= 0) { // read failed
            close(fd);
            return 0;
        }
        left -= bytes_read;
        ptr += bytes_read;
    }

    close(fd);
    return 1;
}